

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-callback-order.c
# Opt level: O1

int run_test_callback_order(void)

{
  int iVar1;
  uv_loop_t *loop;
  uv_loop_t *puVar2;
  uv_idle_t idle;
  
  puVar2 = (uv_loop_t *)&stack0xffffffffffffff78;
  loop = uv_default_loop();
  uv_idle_init(loop,(uv_idle_t *)&stack0xffffffffffffff78);
  uv_idle_start((uv_idle_t *)&stack0xffffffffffffff78,next_tick);
  if (idle_cb_called == 0) {
    if (timer_cb_called != 0) goto LAB_0014a0ad;
    uv_run(loop,UV_RUN_DEFAULT);
    if (idle_cb_called != 1) goto LAB_0014a0b2;
    if (timer_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      loop = uv_default_loop();
      iVar1 = uv_loop_close(loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014a0bc;
    }
  }
  else {
    run_test_callback_order_cold_1();
LAB_0014a0ad:
    loop = puVar2;
    run_test_callback_order_cold_2();
LAB_0014a0b2:
    run_test_callback_order_cold_3();
  }
  run_test_callback_order_cold_4();
LAB_0014a0bc:
  run_test_callback_order_cold_5();
  puVar2 = *(uv_loop_t **)&loop->active_handles;
  uv_idle_stop((uv_idle_t *)loop);
  uv_idle_init(puVar2,&idle_handle);
  uv_idle_start(&idle_handle,idle_cb);
  uv_timer_init(puVar2,&timer_handle);
  iVar1 = uv_timer_start(&timer_handle,timer_cb,0,0);
  return iVar1;
}

Assistant:

TEST_IMPL(callback_order) {
  uv_loop_t* loop;
  uv_idle_t idle;

  loop = uv_default_loop();
  uv_idle_init(loop, &idle);
  uv_idle_start(&idle, next_tick);

  ASSERT(idle_cb_called == 0);
  ASSERT(timer_cb_called == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(idle_cb_called == 1);
  ASSERT(timer_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}